

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::collect_labels_from_leaf
               (memory_tree *b,uint32_t cn,v_array<unsigned_int> *leaf_labs)

{
  node *pnVar1;
  long lVar2;
  example *peVar3;
  wclass *pwVar4;
  bool bVar5;
  ostream *poVar6;
  wclass *pwVar7;
  size_t i;
  ulong uVar8;
  uint32_t lab;
  float local_3c;
  long local_38;
  
  local_38 = (ulong)cn * 0x48;
  if ((b->nodes)._begin[cn].internal != -1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"something is wrong, it should be a leaf node");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  v_array<unsigned_int>::clear(leaf_labs);
  for (uVar8 = 0; pnVar1 = (b->nodes)._begin,
      lVar2 = *(long *)((long)&(pnVar1->examples_index)._begin + local_38),
      uVar8 < (ulong)(*(long *)((long)&(pnVar1->examples_index)._end + local_38) - lVar2 >> 2);
      uVar8 = uVar8 + 1) {
    peVar3 = (b->examples)._begin[*(uint *)(lVar2 + uVar8 * 4)];
    pwVar4 = (peVar3->l).cs.costs._end;
    for (pwVar7 = (wclass *)(peVar3->l).multilabels.label_v._begin; pwVar7 != pwVar4;
        pwVar7 = (wclass *)&pwVar7->class_index) {
      local_3c = pwVar7->x;
      bVar5 = v_array_contains<unsigned_int>(leaf_labs,(uint)local_3c);
      if (!bVar5) {
        v_array<unsigned_int>::push_back(leaf_labs,(uint *)&local_3c);
      }
    }
  }
  return;
}

Assistant:

void collect_labels_from_leaf(memory_tree& b, const uint32_t cn, v_array<uint32_t>& leaf_labs){
        if (b.nodes[cn].internal != -1)
            cout<<"something is wrong, it should be a leaf node"<<endl;
    
        leaf_labs.clear();
        for (size_t i = 0; i < b.nodes[cn].examples_index.size(); i++){ //scan through each memory in the leaf
            uint32_t loc = b.nodes[cn].examples_index[i];
            for (uint32_t lab: b.examples[loc]->l.multilabels.label_v){ //scan through each label:
                if (v_array_contains(leaf_labs, lab) == false)
                    leaf_labs.push_back(lab); 
            }
        }
    }